

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_18fc05::SQLiteBuildDB::getKeys
          (SQLiteBuildDB *this,
          vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> *keys_out,
          string *error_out)

{
  int iVar1;
  char *data;
  int __oflag;
  bool bVar2;
  sqlite3_stmt *stmt;
  string local_48;
  
  std::mutex::lock(&this->dbMutex);
  iVar1 = open(this,(char *)error_out,__oflag);
  if ((char)iVar1 == '\0') {
    bVar2 = false;
  }
  else {
    iVar1 = sqlite3_prepare_v2(this->db,"SELECT key FROM key_names;",0xffffffffffffffff,&stmt,0);
    bVar2 = iVar1 == 0;
    if (bVar2) {
      while( true ) {
        iVar1 = sqlite3_step(stmt);
        if (iVar1 != 100) break;
        iVar1 = sqlite3_column_count();
        if (iVar1 != 1) {
          __assert_fail("sqlite3_column_count(stmt) == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                        ,0x2d5,
                        "virtual bool (anonymous namespace)::SQLiteBuildDB::getKeys(std::vector<KeyType> &, std::string *)"
                       );
        }
        iVar1 = sqlite3_column_bytes(stmt,0);
        data = (char *)sqlite3_column_text(stmt,0);
        llbuild::core::KeyType::KeyType((KeyType *)&local_48,data,(long)iVar1);
        std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::
        emplace_back<llbuild::core::KeyType>(keys_out,(KeyType *)&local_48);
        std::__cxx11::string::_M_dispose();
      }
      sqlite3_finalize(stmt);
    }
    else {
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_48,this);
      std::__cxx11::string::operator=((string *)error_out,(string *)&local_48);
      std::__cxx11::string::_M_dispose();
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->dbMutex);
  return bVar2;
}

Assistant:

virtual bool getKeys(std::vector<KeyType>& keys_out, std::string* error_out) override {
    std::lock_guard<std::mutex> guard(dbMutex);

    if (!open(error_out))
      return false;

    // Search for the key in the database
    int result;
    sqlite3_stmt* stmt;
    result = sqlite3_prepare_v2(db, "SELECT key FROM key_names;",
                                -1, &stmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    while (sqlite3_step(stmt) == SQLITE_ROW) {
      assert(sqlite3_column_count(stmt) == 1);

      auto size = sqlite3_column_bytes(stmt, 0);
      auto text = (const char*) sqlite3_column_text(stmt, 0);

      keys_out.push_back(KeyType(text, size));
    }

    sqlite3_finalize(stmt);

    return true;
  }